

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

__ssize_t __thiscall
httplib::detail::stream_line_reader::getline
          (stream_line_reader *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  int iVar1;
  undefined7 uVar3;
  ulong uVar2;
  long lVar4;
  char byte;
  char local_19;
  
  uVar2 = 0;
  this->fixed_buffer_used_size_ = 0;
  (this->glowable_buffer_)._M_string_length = 0;
  *(this->glowable_buffer_)._M_dataplus._M_p = '\0';
  iVar1 = (*this->strm_->_vptr_Stream[2])(this->strm_,&local_19,1);
  if (-1 < iVar1) {
    lVar4 = 0;
    do {
      uVar3 = (undefined7)((ulong)&local_19 >> 8);
      if (iVar1 == 0) {
        uVar2 = CONCAT71(uVar3,lVar4 != 0);
        goto LAB_00142e90;
      }
      append(this,local_19);
      if (local_19 == '\n') {
        uVar2 = CONCAT71(uVar3,1);
        goto LAB_00142e90;
      }
      iVar1 = (*this->strm_->_vptr_Stream[2])(this->strm_,&local_19,1);
      lVar4 = lVar4 + -1;
    } while (-1 < iVar1);
    uVar2 = 0;
  }
LAB_00142e90:
  return uVar2 & 0xffffffff;
}

Assistant:

bool getline() {
    fixed_buffer_used_size_ = 0;
    glowable_buffer_.clear();

    for (size_t i = 0;; i++) {
      char byte;
      auto n = strm_.read(&byte, 1);

      if (n < 0) {
        return false;
      } else if (n == 0) {
        if (i == 0) {
          return false;
        } else {
          break;
        }
      }

      append(byte);

      if (byte == '\n') { break; }
    }

    return true;
  }